

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coder.cc
# Opt level: O0

void __thiscall Encoder::~Encoder(Encoder *this)

{
  ostream *poVar1;
  allocator<unsigned_char> local_2a;
  byte local_29;
  S2LogMessage local_28;
  S2LogMessageVoidify local_11;
  Encoder *local_10;
  Encoder *this_local;
  
  local_29 = 0;
  local_10 = this;
  if (this->limit_ < this->buf_) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/coder.cc"
               ,0x23,kFatal,(ostream *)&std::cerr);
    local_29 = 1;
    poVar1 = S2LogMessage::stream(&local_28);
    poVar1 = std::operator<<(poVar1,"Check failed: (buf_) <= (limit_) ");
    S2LogMessageVoidify::operator&(&local_11,poVar1);
  }
  if ((local_29 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
  }
  if (this->underlying_buffer_ != &kEmptyBuffer) {
    std::allocator<unsigned_char>::allocator(&local_2a);
    __gnu_cxx::new_allocator<unsigned_char>::deallocate
              ((new_allocator<unsigned_char> *)&local_2a,this->underlying_buffer_,
               (long)this->limit_ - (long)this->orig_);
    std::allocator<unsigned_char>::~allocator(&local_2a);
  }
  return;
}

Assistant:

Encoder::~Encoder() {
  S2_CHECK_LE(buf_, limit_);  // Catch the buffer overflow.
  if (underlying_buffer_ != &kEmptyBuffer) {
    std::allocator<unsigned char>().deallocate(
        underlying_buffer_, limit_ - orig_);
  }
}